

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WirehairCodec.cpp
# Opt level: O0

bool __thiscall wirehair::Codec::Triangle(Codec *this)

{
  long lVar1;
  byte bVar2;
  byte bVar3;
  ushort uVar4;
  undefined2 uVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  bool bVar9;
  uint uVar10;
  uint uVar11;
  long lVar12;
  ulong *puVar13;
  ulong *puVar14;
  uint uVar15;
  int iVar16;
  uint uVar17;
  ulong uVar18;
  long in_RDI;
  uint offset;
  uint8_t x;
  uint8_t rem_value;
  uint8_t *rem_row_2;
  uint heavy_row_k_1;
  uint ge_row_k_1;
  uint pivot_k_1;
  uint16_t temp;
  uint8_t code_value_1;
  uint8_t *pivot_row_1;
  uint heavy_row_j;
  uint ge_row_j_1;
  uint32_t window;
  uint32_t bits;
  uint32_t *word;
  uint64_t temp_mask;
  uint ge_column_i;
  uint odd_count;
  uint64_t *pivot_row;
  uint8_t code_value;
  uint8_t *rem_row_1;
  uint heavy_row_k;
  uint end;
  uint ii;
  uint64_t *rem_row;
  uint ge_row_k;
  uint pivot_k;
  uint64_t row0;
  uint64_t *ge_row;
  uint ge_row_j;
  uint pivot_j;
  bool found;
  uint64_t *ge_matrix_offset;
  uint word_offset;
  uint heavy_col_i;
  uint pivot_i;
  uint64_t ge_mask;
  uint first_heavy_pivot;
  uint first_heavy_row;
  uint column_count;
  uint pivot_count;
  uint first_heavy_column;
  int in_stack_000002f4;
  void *in_stack_000002f8;
  uint8_t in_stack_00000307;
  void *in_stack_00000308;
  uint local_d8;
  uint *local_b8;
  ulong local_b0;
  undefined4 in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff5c;
  uint local_7c;
  uint local_6c;
  uint local_50;
  uint local_34;
  ulong local_30;
  uint local_24;
  bool local_3;
  
  uVar6 = *(uint *)(in_RDI + 0xf4);
  if ((uVar6 <= *(uint *)(in_RDI + 0xd8)) ||
     (bVar9 = TriangleNonHeavy((Codec *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58
                                                )), bVar9)) {
    uVar7 = *(uint *)(in_RDI + 0xc0);
    uVar15 = (uint)*(ushort *)(in_RDI + 0x8e) + (uint)*(ushort *)(in_RDI + 0x18);
    iVar16 = (uint)*(ushort *)(in_RDI + 0x8e) + (uint)*(ushort *)(in_RDI + 10);
    local_24 = *(uint *)(in_RDI + 0xf8);
    local_30 = 1L << ((byte)*(undefined4 *)(in_RDI + 0xd8) & 0x3f);
    for (local_34 = *(uint *)(in_RDI + 0xd8); local_34 < uVar15; local_34 = local_34 + 1) {
      uVar17 = local_34 - uVar6;
      lVar12 = *(long *)(in_RDI + 0x98) + (ulong)(local_34 >> 6) * 8;
      bVar9 = false;
      local_50 = local_34;
      while( true ) {
        if (local_24 <= local_50) goto LAB_0010a79c;
        uVar4 = *(ushort *)(*(long *)(in_RDI + 0xb8) + (ulong)local_50 * 2);
        puVar13 = (ulong *)(lVar12 + (ulong)(*(int *)(in_RDI + 0xa8) * (uint)uVar4) * 8);
        if ((*puVar13 & local_30) != 0) break;
        local_50 = local_50 + 1;
      }
      bVar9 = true;
      *(undefined2 *)(*(long *)(in_RDI + 0xb8) + (ulong)local_50 * 2) =
           *(undefined2 *)(*(long *)(in_RDI + 0xb8) + (ulong)local_34 * 2);
      *(ushort *)(*(long *)(in_RDI + 0xb8) + (ulong)local_34 * 2) = uVar4;
      uVar18 = *puVar13;
      local_6c = local_50;
      while (local_6c = local_6c + 1, local_6c < local_24) {
        puVar14 = (ulong *)(lVar12 + (ulong)(*(int *)(in_RDI + 0xa8) *
                                            (uint)*(ushort *)
                                                   (*(long *)(in_RDI + 0xb8) + (ulong)local_6c * 2))
                                     * 8);
        if ((*puVar14 & local_30) != 0) {
          *puVar14 = uVar18 & (local_30 - 1 ^ 0xffffffffffffffff) ^ local_30 ^ *puVar14;
          local_7c = 1;
          iVar8 = *(int *)(in_RDI + 0xa8);
          for (; local_7c < iVar8 - (local_34 >> 6); local_7c = local_7c + 1) {
            puVar14[local_7c] = puVar13[local_7c] ^ puVar14[local_7c];
          }
        }
      }
      for (; local_6c < uVar7; local_6c = local_6c + 1) {
        lVar12 = *(long *)(in_RDI + 0xe0) +
                 (ulong)(*(int *)(in_RDI + 0xe8) *
                        ((uint)*(ushort *)(*(long *)(in_RDI + 0xb8) + (ulong)local_6c * 2) - iVar16)
                        );
        bVar2 = *(byte *)(lVar12 + (ulong)uVar17);
        if (bVar2 != 0) {
          lVar1 = *(long *)(in_RDI + 0x98) + (ulong)(*(int *)(in_RDI + 0xa8) * (uint)uVar4) * 8;
          uVar10 = local_34 & 3;
          uVar11 = local_34 + 1;
          local_b0 = local_30;
          if (uVar10 == 0) {
            local_b0 = local_30 << 1 | local_30 >> 0x3f;
            if ((*(ulong *)(lVar1 + (ulong)(uVar11 >> 6) * 8) & local_b0) != 0) {
              uVar18 = (ulong)(uVar11 - *(int *)(in_RDI + 0xf4));
              *(byte *)(lVar12 + uVar18) = *(byte *)(lVar12 + uVar18) ^ bVar2;
            }
            uVar11 = local_34 + 2;
LAB_0010a5f1:
            local_b0 = local_b0 << 1 | local_b0 >> 0x3f;
            if ((*(ulong *)(lVar1 + (ulong)(uVar11 >> 6) * 8) & local_b0) != 0) {
              uVar18 = (ulong)(uVar11 - *(int *)(in_RDI + 0xf4));
              *(byte *)(lVar12 + uVar18) = *(byte *)(lVar12 + uVar18) ^ bVar2;
            }
            uVar11 = uVar11 + 1;
LAB_0010a65b:
            if ((*(ulong *)(lVar1 + (ulong)(uVar11 >> 6) * 8) & (local_b0 << 1 | local_b0 >> 0x3f))
                != 0) {
              uVar18 = (ulong)(uVar11 - *(int *)(in_RDI + 0xf4));
              *(byte *)(lVar12 + uVar18) = *(byte *)(lVar12 + uVar18) ^ bVar2;
            }
            uVar11 = local_34 + (4 - uVar10);
          }
          else {
            if (uVar10 == 1) goto LAB_0010a5f1;
            if (uVar10 == 2) goto LAB_0010a65b;
          }
          local_b8 = (uint *)((lVar12 + (ulong)uVar11) - (ulong)uVar6);
          for (; uVar11 < uVar15; uVar11 = uVar11 + 4) {
            *local_b8 = *(int *)(GF256_MULT_LOOKUP +
                                (ulong)((uint)(*(ulong *)(lVar1 + (ulong)(uVar11 >> 6) * 8) >>
                                              ((byte)uVar11 & 0x3f)) & 0xf) * 4) * (uint)bVar2 ^
                        *local_b8;
            local_b8 = local_b8 + 1;
          }
        }
      }
LAB_0010a79c:
      if (!bVar9) {
        for (; local_50 < *(uint *)(in_RDI + 0xc0); local_50 = local_50 + 1) {
          uVar4 = *(ushort *)(*(long *)(in_RDI + 0xb8) + (ulong)local_50 * 2);
          bVar2 = *(byte *)(*(long *)(in_RDI + 0xe0) +
                            (ulong)(*(int *)(in_RDI + 0xe8) * ((uint)uVar4 - iVar16)) +
                           (ulong)uVar17);
          if (bVar2 != 0) {
            bVar9 = true;
            *(undefined2 *)(*(long *)(in_RDI + 0xb8) + (ulong)local_50 * 2) =
                 *(undefined2 *)(*(long *)(in_RDI + 0xb8) + (ulong)local_34 * 2);
            *(ushort *)(*(long *)(in_RDI + 0xb8) + (ulong)local_34 * 2) = uVar4;
            if (local_34 < local_24) {
              uVar5 = *(undefined2 *)(*(long *)(in_RDI + 0xb8) + (ulong)local_24 * 2);
              *(undefined2 *)(*(long *)(in_RDI + 0xb8) + (ulong)local_24 * 2) =
                   *(undefined2 *)(*(long *)(in_RDI + 0xb8) + (ulong)local_50 * 2);
              *(undefined2 *)(*(long *)(in_RDI + 0xb8) + (ulong)local_50 * 2) = uVar5;
              local_24 = local_24 + 1;
            }
            local_d8 = local_50 + 1;
            if (local_d8 < uVar7) {
              for (; local_d8 < uVar7; local_d8 = local_d8 + 1) {
                lVar12 = *(long *)(in_RDI + 0xe0) +
                         (ulong)(*(int *)(in_RDI + 0xe8) *
                                ((uint)*(ushort *)(*(long *)(in_RDI + 0xb8) + (ulong)local_d8 * 2) -
                                iVar16));
                bVar3 = *(byte *)(lVar12 + (ulong)uVar17);
                if (bVar3 != 0) {
                  *(uint8_t *)(lVar12 + (ulong)uVar17) =
                       GF256Ctx.GF256_DIV_TABLE[(uint)bVar2 * 0x100 + (uint)bVar3];
                  gf256_muladd_mem(in_stack_00000308,in_stack_00000307,in_stack_000002f8,
                                   in_stack_000002f4);
                }
              }
            }
            break;
          }
        }
      }
      if (!bVar9) {
        *(uint *)(in_RDI + 0xd8) = local_34;
        *(uint *)(in_RDI + 0xf8) = local_24;
        return false;
      }
      local_30 = local_30 << 1 | local_30 >> 0x3f;
    }
    local_3 = true;
  }
  else {
    local_3 = false;
  }
  return local_3;
}

Assistant:

bool Codec::Triangle()
{
    CAT_IF_DUMP(cout << endl << "---- Triangle ----" << endl << endl;)

    const unsigned first_heavy_column = _first_heavy_column;

    // If next pivot is not heavy:
    if (_next_pivot < first_heavy_column &&
        !TriangleNonHeavy())
    {
        return false;
    }

    const unsigned pivot_count = _pivot_count;
    const unsigned column_count = _defer_count + _mix_count;
    const unsigned first_heavy_row = _defer_count + _dense_count;
    unsigned first_heavy_pivot = _first_heavy_pivot;

    uint64_t ge_mask = (uint64_t)1 << (_next_pivot & 63);

    // For each heavy pivot to determine:
    for (unsigned pivot_i = _next_pivot; pivot_i < column_count;
        ++pivot_i, ge_mask = CAT_ROL64(ge_mask, 1))
    {
        CAT_DEBUG_ASSERT(pivot_i >= first_heavy_column);
        const unsigned heavy_col_i = pivot_i - first_heavy_column;

        const unsigned word_offset = pivot_i >> 6;
        uint64_t * GF256_RESTRICT ge_matrix_offset = _ge_matrix + word_offset;
        bool found = false;
        unsigned pivot_j;

        // For each remaining GE row that might be the pivot:
        for (pivot_j = pivot_i; pivot_j < first_heavy_pivot; ++pivot_j)
        {
            const unsigned ge_row_j = _pivots[pivot_j];
            uint64_t * GF256_RESTRICT ge_row = &ge_matrix_offset[_ge_pitch * ge_row_j];

            // If the bit was not found:
            if (0 == (*ge_row & ge_mask)) {
                continue; // Skip to next
            }

            // Found it!
            found = true;

            CAT_IF_DUMP(cout << "Pivot " << pivot_i << " found on row " << ge_row_j << endl;)

            // Swap out the pivot index for this one
            _pivots[pivot_j] = _pivots[pivot_i];
            CAT_DEBUG_ASSERT(ge_row_j < _pivot_count);
            _pivots[pivot_i] = (uint16_t)ge_row_j;

            // Prepare masked first word
            const uint64_t row0 = (*ge_row & ~(ge_mask - 1)) ^ ge_mask;

            unsigned pivot_k = pivot_j + 1;

            // For each remaining light row:
            for (; pivot_k < first_heavy_pivot; ++pivot_k)
            {
                // Determine if the row contains the bit we want
                unsigned ge_row_k = _pivots[pivot_k];
                uint64_t * GF256_RESTRICT rem_row = &ge_matrix_offset[_ge_pitch * ge_row_k];

                // If the bit was found:
                if (0 != (*rem_row & ge_mask))
                {
                    // Unroll first word to handle masked word and for speed
                    *rem_row ^= row0;

                    // Add the pivot row to eliminate the bit from this row, preserving previous bits
                    for (unsigned ii = 1, end = _ge_pitch - word_offset; ii < end; ++ii) {
                        rem_row[ii] ^= ge_row[ii];
                    }
                }
            } // next remaining row

            // For each remaining heavy row:
            for (; pivot_k < pivot_count; ++pivot_k)
            {
                CAT_DEBUG_ASSERT(_pivots[pivot_k] >= first_heavy_row);
                const unsigned heavy_row_k = _pivots[pivot_k] - first_heavy_row;

                uint8_t * GF256_RESTRICT rem_row = &_heavy_matrix[_heavy_pitch * heavy_row_k];
                const uint8_t code_value = rem_row[heavy_col_i];

                // If the column is non-zero:
                if (0 == code_value) {
                    continue;
                }

                CAT_IF_DUMP(cout << "Eliminating from heavy row " << heavy_row_k << " :";)

                // For each set bit in the binary pivot row, add rem[i] to rem[i+]:
                uint64_t * GF256_RESTRICT pivot_row = &_ge_matrix[_ge_pitch * ge_row_j];

#if !defined(CAT_HEAVY_WIN_MULT)
                for (unsigned ge_column_i = pivot_i + 1; ge_column_i < column_count; ++ge_column_i)
                {
                    const uint64_t mask = (uint64_t)1 << (ge_column_i & 63);
                    const uint64_t word = pivot_row[ge_column_i >> 6];
                    const bool nonzero = 0 != (word & mask);

                    if (nonzero) {
                        rem_row[ge_column_i - first_heavy_column] ^= code_value;
                    }
                }
#else // CAT_HEAVY_WIN_MULT
                const unsigned odd_count = pivot_i & 3;
                unsigned ge_column_i = pivot_i + 1;
                uint64_t temp_mask = ge_mask;

                // Unroll odd columns:
                switch (odd_count)
                {
                case 0: temp_mask = CAT_ROL64(temp_mask, 1);
                        if (0 != (pivot_row[ge_column_i >> 6] & temp_mask))
                        {
                            CAT_DEBUG_ASSERT(ge_column_i >= _first_heavy_column);
                            rem_row[ge_column_i - _first_heavy_column] ^= code_value;
                            CAT_IF_DUMP(cout << " " << ge_column_i;)
                        }
                        ++ge_column_i;

                        // Fall-thru...
                case 1: temp_mask = CAT_ROL64(temp_mask, 1);
                        if (0 != (pivot_row[ge_column_i >> 6] & temp_mask))
                        {
                            CAT_DEBUG_ASSERT(ge_column_i >= _first_heavy_column);
                            rem_row[ge_column_i - _first_heavy_column] ^= code_value;
                            CAT_IF_DUMP(cout << " " << ge_column_i;)
                        }
                        ++ge_column_i;

                        // Fall-thru...
                case 2: temp_mask = CAT_ROL64(temp_mask, 1);
                        if (0 != (pivot_row[ge_column_i >> 6] & temp_mask))
                        {
                            CAT_DEBUG_ASSERT(ge_column_i >= _first_heavy_column);
                            rem_row[ge_column_i - _first_heavy_column] ^= code_value;
                            CAT_IF_DUMP(cout << " " << ge_column_i;)
                        }

                        // Set GE column to next even column
                        CAT_DEBUG_ASSERT(odd_count <= 4);
                        ge_column_i = pivot_i + (4 - odd_count);
                }

                uint32_t * GF256_RESTRICT word = reinterpret_cast<uint32_t*>(rem_row + ge_column_i - first_heavy_column);

                // For remaining aligned columns:
                for (; ge_column_i < column_count; ge_column_i += 4, ++word)
                {
                    // Look up 4 bit window
                    const uint32_t bits = (uint32_t)(pivot_row[ge_column_i >> 6] >> (ge_column_i & 63)) & 15;
#if defined(CAT_ENDIAN_UNKNOWN)
                    const uint32_t window = getLE(GF256_MULT_LOOKUP[bits]);
#else
                    const uint32_t window = GF256_MULT_LOOKUP[bits];
#endif

                    CAT_IF_DUMP(cout << " " << ge_column_i << "x" << hex << setw(8) << setfill('0') << window << dec;)

                    *word ^= window * code_value;
                }
#endif // CAT_HEAVY_WIN_MULT
                CAT_IF_DUMP(cout << endl;)
            } // next heavy row

            break;
        } // next row

        // If not found, then for each remaining heavy pivot:
        // NOTE: The pivot array maintains the heavy rows at the end so that they are always tried last
        if (!found) for (; pivot_j < _pivot_count; ++pivot_j)
        {
            const unsigned ge_row_j = _pivots[pivot_j];
            CAT_DEBUG_ASSERT(ge_row_j >= first_heavy_row);
            const unsigned heavy_row_j = ge_row_j - first_heavy_row;
            CAT_DEBUG_ASSERT(heavy_row_j < _heavy_rows);
            uint8_t * GF256_RESTRICT pivot_row = &_heavy_matrix[_heavy_pitch * heavy_row_j];
            const uint8_t code_value = pivot_row[heavy_col_i];

            // If heavy row doesn't have the pivot:
            if (0 == code_value) {
                continue; // Skip to next
            }

            // Found it! (common case)
            found = true;

            CAT_IF_DUMP(cout << "Pivot " << pivot_i << " found on heavy row " << ge_row_j << endl;)

            // Swap pivot i and j
            _pivots[pivot_j] = _pivots[pivot_i];
            _pivots[pivot_i] = (uint16_t)ge_row_j;

            // If a non-heavy pivot just got moved into heavy pivot list:
            if (pivot_i < first_heavy_pivot)
            {
                // Swap pivot j with first heavy pivot
                const uint16_t temp = _pivots[first_heavy_pivot];
                _pivots[first_heavy_pivot] = _pivots[pivot_j];
                _pivots[pivot_j] = temp;

                // And move the first heavy pivot up one to cover the hole
                ++first_heavy_pivot;
            }

            unsigned pivot_k = pivot_j + 1;

            // If there are any remaining rows:
            if (pivot_k < pivot_count)
            {
                // For each remaining unused row:
                // Note all remaining rows are heavy rows by pivot array organization
                for (; pivot_k < pivot_count; ++pivot_k)
                {
                    const unsigned ge_row_k = _pivots[pivot_k];
                    CAT_DEBUG_ASSERT(ge_row_k >= first_heavy_row);
                    const unsigned heavy_row_k = ge_row_k - first_heavy_row;
                    CAT_DEBUG_ASSERT(heavy_row_k < _heavy_rows);
                    uint8_t * GF256_RESTRICT rem_row = &_heavy_matrix[_heavy_pitch * heavy_row_k];
                    const uint8_t rem_value = rem_row[heavy_col_i];

                    // If the column is zero:
                    if (0 == rem_value) {
                        continue; // Skip it
                    }

                    // x = rem_value / code_value
                    const uint8_t x = gf256_div(rem_value, code_value);

                    // Store value for later
                    rem_row[heavy_col_i] = x;

                    const unsigned offset = heavy_col_i + 1;
                    CAT_DEBUG_ASSERT(_heavy_columns >= offset);

                    // rem[i+] += x * pivot[i+]
                    gf256_muladd_mem(
                        rem_row + offset,
                        x,
                        pivot_row + offset,
                        _heavy_columns - offset);
                } // next remaining row
            }

            break;
        } // next heavy row

        // If pivot could not be found:
        if (!found)
        {
            _next_pivot = pivot_i;
            _first_heavy_pivot = first_heavy_pivot;

            CAT_IF_DUMP(cout << "Singular: Pivot " << pivot_i << " of " <<
                (_defer_count + _mix_count) << " not found!" << endl;)

            CAT_IF_PIVOT(if (pivot_i + 16 < (unsigned)(_defer_count + _mix_count)) {
                cout << ">>>>> Singular: Pivot " << pivot_i << " of " <<
                    (_defer_count + _mix_count) << " not found!" << endl << endl;
            })

            return false;
        }

        CAT_IF_DUMP( PrintGEMatrix(); )
        CAT_IF_DUMP( PrintExtraMatrix(); )
    }

    return true;
}